

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

int32_t decShiftToLeast(uint8_t *uar,int32_t units,int32_t shift)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint8_t uVar6;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  iVar10 = (int)uar;
  if (shift == 0) {
    return units;
  }
  if (shift == units) {
    *uar = '\0';
    return 1;
  }
  uVar11 = shift;
  if (shift < 0x32) {
    bVar2 = ""[shift];
    iVar8 = shift - (bVar2 - 1);
    uVar11 = (uint)bVar2;
    if (iVar8 != 1) {
      bVar2 = (&DAT_003a56ef)[bVar2];
      uVar3 = multies[iVar8];
      uVar11 = (uar[bVar2] >> ((byte)iVar8 & 0x1f)) * uVar3 >> 0x11;
      iVar13 = 1 - iVar8;
      *uar = (uint8_t)uVar11;
      iVar14 = (units - iVar13) - shift;
      if (0 < iVar14) {
        uVar4 = DECPOWERS[iVar8];
        uVar5 = DECPOWERS[iVar13];
        iVar9 = ~shift + units;
        do {
          uVar12 = (uar[(ulong)bVar2 + 1] >> ((byte)iVar8 & 0x1f)) * uVar3 >> 0x11;
          uVar6 = (uint8_t)uVar12;
          *uar = (uar[(ulong)bVar2 + 1] - uVar6 * (char)uVar4) * (char)uVar5 + (char)uVar11;
          if (iVar9 < 1) break;
          uar[1] = uVar6;
          uar = uar + 1;
          iVar14 = (iVar14 - iVar8) - iVar13;
          iVar9 = iVar9 + -1;
          uVar11 = uVar12;
        } while (0 < iVar14);
      }
      return ((int)uar - iVar10) + 1;
    }
  }
  if ((int)uVar11 < units) {
    puVar7 = uar + units;
    do {
      puVar1 = uar + uVar11;
      *uar = *puVar1;
      uar = uar + 1;
    } while (puVar1 + 1 < puVar7);
  }
  return (int)uar - iVar10;
}

Assistant:

static Int decShiftToLeast(Unit *uar, Int units, Int shift) {
  Unit  *target, *up;              /* work  */
  Int   cut, count;                /* work  */
  Int   quot, rem;                 /* for division  */

  if (shift==0) return units;      /* [fastpath] nothing to do  */
  if (shift==units*DECDPUN) {      /* [fastpath] little to do  */
    *uar=0;                        /* all digits cleared gives zero  */
    return 1;                      /* leaves just the one  */
    }

  target=uar;                      /* both paths  */
  cut=MSUDIGITS(shift);
  if (cut==DECDPUN) {              /* unit-boundary case; easy  */
    up=uar+D2U(shift);
    for (; up<uar+units; target++, up++) *target=*up;
    return static_cast<int32_t>(target-uar);
    }

  /* messier  */
  up=uar+D2U(shift-cut);           /* source; correct to whole Units  */
  count=units*DECDPUN-shift;       /* the maximum new length  */
  #if DECDPUN<=4
    quot=QUOT10(*up, cut);
  #else
    quot=*up/powers[cut];
  #endif
  for (; ; target++) {
    *target=(Unit)quot;
    count-=(DECDPUN-cut);
    if (count<=0) break;
    up++;
    quot=*up;
    #if DECDPUN<=4
      quot=QUOT10(quot, cut);
      rem=*up-quot*powers[cut];
    #else
      rem=quot%powers[cut];
      quot=quot/powers[cut];
    #endif
    *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
    count-=cut;
    if (count<=0) break;
    }
  return static_cast<int32_t>(target-uar+1);
  }